

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void crnlib::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  long lVar1;
  
  for (lVar1 = (ulong)num * 0x68; lVar1 != 0; lVar1 = lVar1 + -0x68) {
    tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node::vq_node
              ((vq_node *)pDst_void,(vq_node *)pSrc_void);
    pSrc_void = (void *)((long)pSrc_void + 0x68);
    pDst_void = (void *)((long)pDst_void + 0x68);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num) {
    T* pSrc = static_cast<T*>(pSrc_void);
    T* const pSrc_end = pSrc + num;
    T* pDst = static_cast<T*>(pDst_void);

    while (pSrc != pSrc_end) {
      // placement new
      new (static_cast<void*>(pDst)) T(*pSrc);
      pSrc->~T();
      ++pSrc;
      ++pDst;
    }
  }